

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::tuple_caster<std::tuple,double,double,double>::
       cast_impl<std::tuple<double,double,double>,0ul,1ul,2ul>(undefined8 *src)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  handle hVar4;
  tuple result;
  array<pybind11::object,_3UL> entries;
  
  entries._M_elems[0].super_handle.m_ptr = (handle)PyFloat_FromDouble(src[2]);
  entries._M_elems[1].super_handle.m_ptr = (handle)PyFloat_FromDouble(src[1]);
  entries._M_elems[2].super_handle.m_ptr = (handle)PyFloat_FromDouble(*src);
  hVar4.m_ptr = (PyObject *)0x0;
  lVar3 = 0;
  while (lVar3 != 0x18) {
    plVar1 = (long *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
    lVar3 = lVar3 + 8;
    if (*plVar1 == 0) goto LAB_0019a785;
  }
  tuple::tuple(&result,3);
  hVar4.m_ptr = (PyObject *)result;
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    uVar2 = *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
    *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3) = 0;
    if ((*(byte *)(*(long *)((long)result.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                    ,0x588,
                    "static handle pybind11::detail::tuple_caster<std::tuple, double, double, double>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <double, double, double>, T = std::tuple<double, double, double>, Is = <0UL, 1UL, 2UL>]"
                   );
    }
    *(undefined8 *)((long)result.super_object.super_handle.m_ptr + 0x18 + lVar3) = uVar2;
  }
  result.super_object.super_handle.m_ptr = (object)(handle)0x0;
  pybind11::object::~object(&result.super_object);
LAB_0019a785:
  std::array<pybind11::object,_3UL>::~array(&entries);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }